

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj.c
# Opt level: O2

void objCopy(void *dest,void *src)

{
  memMove(dest,src,*src);
  objShiftPtrs(dest,(long)dest - (long)src);
  return;
}

Assistant:

void objCopy(void* dest, const void* src)
{
	ASSERT(objIsOperable(src));
	ASSERT(memIsValid(dest, objKeep(src)));
	// скопировать данные
	memMove(dest, src, objKeep(src));
	// сдвинуть указатели
	objShiftPtrs(dest, (const octet*)dest - (const octet*)src);
}